

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::SamplerTest::init
          (SamplerTest *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int extraout_EAX;
  ContextInfo *pCVar2;
  ContextType local_ac;
  RequiredExtensions local_a8;
  ContextType local_90;
  ContextType local_8c;
  RequiredExtensions local_88;
  ContextType local_70;
  ContextType local_6c;
  RequiredExtensions local_68;
  ContextType local_50 [4];
  undefined1 local_40 [8];
  RequiredExtensions extensions;
  undefined1 local_20 [8];
  UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> ctxInfo;
  SamplerTest *this_local;
  
  ctxInfo.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data._8_8_ =
       this;
  pCVar2 = glu::ContextInfo::create(this->m_renderCtx);
  de::DefaultDeleter<glu::ContextInfo>::DefaultDeleter
            ((DefaultDeleter<glu::ContextInfo> *)
             ((long)&extensions.m_extensions.
                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  de::details::UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::UniquePtr
            ((UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)local_20,pCVar2);
  RequiredExtensions::RequiredExtensions((RequiredExtensions *)local_40);
  local_50[0].super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = isCoreTextureParam(local_50,this->m_pname);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_6c.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
    getTextureParamExtension(&local_68,&local_6c,this->m_pname);
    RequiredExtensions::add((RequiredExtensions *)local_40,&local_68);
    RequiredExtensions::~RequiredExtensions(&local_68);
  }
  local_70.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = isCoreQuery(&local_70,this->m_type);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_8c.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
    getQueryExtension(&local_88,&local_8c,this->m_type);
    RequiredExtensions::add((RequiredExtensions *)local_40,&local_88);
    RequiredExtensions::~RequiredExtensions(&local_88);
  }
  local_90.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = isCoreTester(&local_90,this->m_tester);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_ac.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
    getTesterExtension(&local_a8,&local_ac,this->m_tester);
    RequiredExtensions::add((RequiredExtensions *)local_40,&local_a8);
    RequiredExtensions::~RequiredExtensions(&local_a8);
  }
  pCVar2 = de::details::UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::
           operator*((UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)local_20
                    );
  RequiredExtensions::check((RequiredExtensions *)local_40,pCVar2);
  RequiredExtensions::~RequiredExtensions((RequiredExtensions *)local_40);
  de::details::UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::~UniquePtr
            ((UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)local_20);
  return extraout_EAX;
}

Assistant:

void SamplerTest::init (void)
{
	const de::UniquePtr<glu::ContextInfo>	ctxInfo		(glu::ContextInfo::create(m_renderCtx));
	RequiredExtensions						extensions;

	// param
	if (!isCoreTextureParam(m_renderCtx.getType(), m_pname))
		extensions.add(getTextureParamExtension(m_renderCtx.getType(), m_pname));

	// query
	if (!isCoreQuery(m_renderCtx.getType(), m_type))
		extensions.add(getQueryExtension(m_renderCtx.getType(), m_type));

	// test type
	if (!isCoreTester(m_renderCtx.getType(), m_tester))
		extensions.add(getTesterExtension(m_renderCtx.getType(), m_tester));

	extensions.check(*ctxInfo);
}